

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ccca::FilterKernel<4U>::FilterKernel(FilterKernel<4U> *this,float multiplier_)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t (*pauVar3) [1024];
  FilterKernel<4U> *pFVar4;
  long lVar5;
  uint8_t (*pauVar6) [1024];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  
  auVar14 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
  auVar15 = vbroadcastss_avx512f(ZEXT416(0x3e3504f3));
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x40));
  uVar2 = 0x43f;
  pauVar3 = Image_Function::Sobel::kernel.kernel + 0x3f;
  pFVar4 = &Image_Function::Sobel::kernel;
  lVar5 = 0;
  do {
    auVar25 = vpbroadcastq_avx512f();
    auVar26 = vpaddq_avx512f(auVar25,auVar16);
    auVar27 = vpaddq_avx512f(auVar25,auVar17);
    auVar28 = vpaddq_avx512f(auVar25,auVar18);
    auVar29 = vpaddq_avx512f(auVar25,auVar19);
    auVar30 = vpaddq_avx512f(auVar25,auVar20);
    auVar31 = vpaddq_avx512f(auVar25,auVar21);
    auVar32 = vpaddq_avx512f(auVar25,auVar22);
    auVar25 = vpaddq_avx512f(auVar25,auVar23);
    auVar33 = vpbroadcastq_avx512f();
    uVar7 = 0;
    auVar34 = vpbroadcastq_avx512f();
    pauVar6 = pauVar3;
    do {
      auVar35 = vpmullq_avx512dq(auVar32,auVar32);
      auVar36 = vpmullq_avx512dq(auVar25,auVar25);
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vpmullq_avx512dq(auVar31,auVar31);
      auVar39 = vpmullq_avx512dq(auVar30,auVar30);
      auVar40 = vpmullq_avx512dq(auVar29,auVar29);
      auVar41 = vpmullq_avx512dq(auVar28,auVar28);
      auVar42 = vpmullq_avx512dq(auVar27,auVar27);
      auVar43 = vpmullq_avx512dq(auVar26,auVar26);
      auVar44 = vporq_avx512f(auVar37,auVar23);
      uVar1 = vpcmpuq_avx512f(auVar44,auVar33,2);
      auVar35 = vpaddq_avx512f(auVar35,auVar34);
      auVar36 = vpaddq_avx512f(auVar36,auVar34);
      auVar39 = vpaddq_avx512f(auVar39,auVar34);
      auVar38 = vpaddq_avx512f(auVar38,auVar34);
      auVar41 = vpaddq_avx512f(auVar41,auVar34);
      auVar40 = vpaddq_avx512f(auVar40,auVar34);
      auVar43 = vpaddq_avx512f(auVar43,auVar34);
      auVar42 = vpaddq_avx512f(auVar42,auVar34);
      auVar10 = vpmovqd_avx512f(auVar36);
      auVar11 = vpmovqd_avx512f(auVar35);
      auVar12 = vpmovqd_avx512f(auVar39);
      auVar35 = vinserti64x4_avx512f(ZEXT3264(auVar10),auVar11,1);
      auVar10 = vpmovqd_avx512f(auVar38);
      auVar11 = vpmovqd_avx512f(auVar40);
      auVar13 = vpmovqd_avx512f(auVar42);
      auVar35 = vcvtudq2ps_avx512f(auVar35);
      auVar36 = vinserti64x4_avx512f(ZEXT3264(auVar10),auVar12,1);
      auVar10 = vpmovqd_avx512f(auVar41);
      auVar35 = vsqrtps_avx512f(auVar35);
      auVar36 = vcvtudq2ps_avx512f(auVar36);
      auVar36 = vsqrtps_avx512f(auVar36);
      auVar38 = vinserti64x4_avx512f(ZEXT3264(auVar11),auVar10,1);
      auVar10 = vpmovqd_avx512f(auVar43);
      auVar38 = vcvtudq2ps_avx512f(auVar38);
      auVar39 = vinserti64x4_avx512f(ZEXT3264(auVar13),auVar10,1);
      auVar38 = vsqrtps_avx512f(auVar38);
      auVar39 = vcvtudq2ps_avx512f(auVar39);
      auVar39 = vsqrtps_avx512f(auVar39);
      auVar35 = vfmadd213ps_avx512f(auVar35,auVar15,auVar14);
      auVar36 = vfmadd213ps_avx512f(auVar36,auVar15,auVar14);
      auVar35 = vcvttps2dq_avx512f(auVar35);
      auVar36 = vcvttps2dq_avx512f(auVar36);
      auVar8 = vpmovdb_avx512f(auVar35);
      auVar35 = vfmadd213ps_avx512f(auVar38,auVar15,auVar14);
      auVar9 = vpmovdb_avx512f(auVar36);
      auVar36 = vfmadd213ps_avx512f(auVar39,auVar15,auVar14);
      auVar10 = vinserti32x4_avx512vl(ZEXT1632(auVar8),auVar9,1);
      auVar35 = vcvttps2dq_avx512f(auVar35);
      auVar36 = vcvttps2dq_avx512f(auVar36);
      auVar8 = vpmovdb_avx512f(auVar35);
      auVar9 = vpmovdb_avx512f(auVar36);
      auVar11 = vinserti32x4_avx512vl(ZEXT1632(auVar8),auVar9,1);
      auVar35 = vinserti64x4_avx512f(ZEXT3264(auVar10),auVar11,1);
      if ((uVar1 & 1) != 0) {
        ((FilterKernel<4U> *)(pauVar6 + -0x3f))->kernel[0][0] = auVar35[0];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-0x3e][0] = auVar35[1];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-0x3d][0] = auVar35[2];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-0x3c][0] = auVar35[3];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-0x3b][0] = auVar35[4];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-0x3a][0] = auVar35[5];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-0x39][0] = auVar35[6];
      }
      if ((uVar1 & 0x80) != 0) {
        pauVar6[-0x38][0] = auVar35[7];
      }
      auVar36 = vporq_avx512f(auVar37,auVar22);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      if ((uVar1 & 1) != 0) {
        pauVar6[-0x37][0] = auVar35[8];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-0x36][0] = auVar35[9];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-0x35][0] = auVar35[10];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-0x34][0] = auVar35[0xb];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-0x33][0] = auVar35[0xc];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-0x32][0] = auVar35[0xd];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-0x31][0] = auVar35[0xe];
      }
      if ((uVar1 & 0x80) != 0) {
        pauVar6[-0x30][0] = auVar35[0xf];
      }
      auVar36 = vporq_avx512f(auVar37,auVar21);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      auVar10 = auVar35._0_32_;
      if ((uVar1 & 1) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2f][0] = auVar8[0];
      }
      if ((uVar1 & 2) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2e][0] = auVar8[1];
      }
      if ((uVar1 & 4) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2d][0] = auVar8[2];
      }
      if ((uVar1 & 8) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2c][0] = auVar8[3];
      }
      if ((uVar1 & 0x10) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2b][0] = auVar8[4];
      }
      if ((uVar1 & 0x20) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x2a][0] = auVar8[5];
      }
      if ((uVar1 & 0x40) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x29][0] = auVar8[6];
      }
      if ((uVar1 & 0x80) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x28][0] = auVar8[7];
      }
      auVar36 = vporq_avx512f(auVar37,auVar20);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      if ((uVar1 & 1) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x27][0] = auVar8[8];
      }
      if ((uVar1 & 2) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x26][0] = auVar8[9];
      }
      if ((uVar1 & 4) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x25][0] = auVar8[10];
      }
      if ((uVar1 & 8) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x24][0] = auVar8[0xb];
      }
      if ((uVar1 & 0x10) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x23][0] = auVar8[0xc];
      }
      if ((uVar1 & 0x20) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x22][0] = auVar8[0xd];
      }
      if ((uVar1 & 0x40) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x21][0] = auVar8[0xe];
      }
      if ((uVar1 & 0x80) != 0) {
        auVar8 = vextracti32x4_avx512vl(auVar10,1);
        pauVar6[-0x20][0] = auVar8[0xf];
      }
      auVar36 = vporq_avx512f(auVar37,auVar19);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      auVar8 = vextracti32x4_avx512f(auVar35,2);
      if ((uVar1 & 1) != 0) {
        pauVar6[-0x1f][0] = auVar8[0];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-0x1e][0] = auVar8[1];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-0x1d][0] = auVar8[2];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-0x1c][0] = auVar8[3];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-0x1b][0] = auVar8[4];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-0x1a][0] = auVar8[5];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-0x19][0] = auVar8[6];
      }
      if ((uVar1 & 0x80) != 0) {
        pauVar6[-0x18][0] = auVar8[7];
      }
      auVar36 = vporq_avx512f(auVar37,auVar18);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      if ((uVar1 & 1) != 0) {
        pauVar6[-0x17][0] = auVar8[8];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-0x16][0] = auVar8[9];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-0x15][0] = auVar8[10];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-0x14][0] = auVar8[0xb];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-0x13][0] = auVar8[0xc];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-0x12][0] = auVar8[0xd];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-0x11][0] = auVar8[0xe];
      }
      if ((uVar1 & 0x80) != 0) {
        pauVar6[-0x10][0] = auVar8[0xf];
      }
      auVar36 = vporq_avx512f(auVar37,auVar17);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      auVar8 = vextracti32x4_avx512f(auVar35,3);
      if ((uVar1 & 1) != 0) {
        pauVar6[-0xf][0] = auVar8[0];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-0xe][0] = auVar8[1];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-0xd][0] = auVar8[2];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-0xc][0] = auVar8[3];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-0xb][0] = auVar8[4];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-10][0] = auVar8[5];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-9][0] = auVar8[6];
      }
      if ((uVar1 & 0x80) != 0) {
        pauVar6[-8][0] = auVar8[7];
      }
      auVar36 = vporq_avx512f(auVar37,auVar16);
      uVar1 = vpcmpuq_avx512f(auVar36,auVar33,2);
      if ((uVar1 & 1) != 0) {
        pauVar6[-7][0] = auVar8[8];
      }
      if ((uVar1 & 2) != 0) {
        pauVar6[-6][0] = auVar8[9];
      }
      if ((uVar1 & 4) != 0) {
        pauVar6[-5][0] = auVar8[10];
      }
      if ((uVar1 & 8) != 0) {
        pauVar6[-4][0] = auVar8[0xb];
      }
      if ((uVar1 & 0x10) != 0) {
        pauVar6[-3][0] = auVar8[0xc];
      }
      if ((uVar1 & 0x20) != 0) {
        pauVar6[-2][0] = auVar8[0xd];
      }
      if ((uVar1 & 0x40) != 0) {
        pauVar6[-1][0] = auVar8[0xe];
      }
      if ((uVar1 & 0x80) != 0) {
        (*pauVar6)[0] = auVar8[0xf];
      }
      auVar25 = vpaddq_avx512f(auVar25,auVar24);
      auVar32 = vpaddq_avx512f(auVar32,auVar24);
      auVar31 = vpaddq_avx512f(auVar31,auVar24);
      auVar30 = vpaddq_avx512f(auVar30,auVar24);
      auVar29 = vpaddq_avx512f(auVar29,auVar24);
      auVar28 = vpaddq_avx512f(auVar28,auVar24);
      auVar27 = vpaddq_avx512f(auVar27,auVar24);
      auVar26 = vpaddq_avx512f(auVar26,auVar24);
      pauVar6 = pauVar6 + 0x40;
      auVar35 = vmovdqu8_avx512bw(auVar35);
      *(undefined1 (*) [64])((long)pFVar4 + uVar7) = auVar35;
      uVar7 = uVar7 + 0x40;
    } while ((uVar2 & 0xffffffffffffffc0) != uVar7);
    lVar5 = lVar5 + 1;
    uVar2 = uVar2 - 1;
    pauVar3 = (uint8_t (*) [1024])(pauVar3[1] + 1);
    pFVar4 = (FilterKernel<4U> *)((long)pFVar4 + 0x401);
  } while (lVar5 != 0x400);
  return;
}

Assistant:

explicit FilterKernel(float multiplier_)
        {
            const uint32_t size = 256u * sizeInBytes;
            for ( uint32_t i = 0; i < size; ++i ) {
                for ( uint32_t j = i; j < size; ++j )
                    kernel[i][j] = kernel[j][i] = static_cast<uint8_t>(sqrtf( static_cast<float>(i * i + j * j) ) * multiplier_ + 0.5f);
            }
        }